

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O3

void zzDiv(word *q,word *r,word *a,size_t n,word *b,size_t m,void *stack)

{
  ulong *puVar1;
  ulong *puVar2;
  word *b_00;
  word wVar3;
  word wVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  word wVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  word *b_01;
  long lVar16;
  size_t sVar17;
  long lVar18;
  size_t sVar19;
  ulong uVar20;
  long lVar21;
  
  iVar11 = wwCmp2(a,n,b,m);
  if (iVar11 < 0) {
    wwSetZero(q,(n - m) + 1);
    stack = a;
  }
  else {
    if (m == 1) {
      if (n == 0) {
        wVar12 = 0;
      }
      else {
        wVar3 = *b;
        wVar12 = 0;
        do {
          sVar13 = n - 1;
          wVar4 = a[n - 1];
          wVar12 = __udivti3(wVar4,wVar12,wVar3,0);
          q[n - 1] = wVar12;
          wVar12 = wVar4 - wVar12 * wVar3;
          n = sVar13;
        } while (sVar13 != 0);
      }
      *r = wVar12;
      return;
    }
    b_01 = (word *)(n * 8 + 8 + (long)stack);
    wwCopy((word *)stack,a,n);
    b_01[-1] = 0;
    wwCopy(b_01,b,m);
    sVar13 = u64CLZ(b[m - 1]);
    wwShHi((word *)stack,n + 1,sVar13);
    wwShHi(b_01,m,sVar13);
    if (m <= n) {
      b_00 = (word *)((long)stack + m * 8 + n * 8 + 8);
      lVar21 = n * 8 + m * -8 + (long)stack;
      sVar17 = n;
      do {
        puVar1 = (ulong *)((long)stack + sVar17 * 8);
        uVar15 = *(ulong *)((long)stack + m * 8 + n * 8);
        wVar12 = 0xffffffffffffffff;
        if (*puVar1 != uVar15) {
          wVar12 = __udivti3(puVar1[-1],*puVar1,uVar15,0);
        }
        lVar16 = sVar17 - m;
        q[lVar16] = wVar12;
        wwCopy(b_00,b_00 + -2,2);
        uVar15 = q[lVar16];
        lVar18 = 0;
        uVar20 = 0;
        do {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = uVar20;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar15;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = b_00[lVar18];
          auVar9 = auVar5 * auVar7 + auVar9;
          uVar20 = auVar9._8_8_;
          b_00[lVar18] = auVar9._0_8_;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 2);
        b_00[2] = uVar20;
        iVar11 = wwCmp2(b_00,3,puVar1 + -2,3);
        while (0 < iVar11) {
          q[lVar16] = q[lVar16] - 1;
          wVar12 = zzSub2(b_00,b_00 + -2,2);
          b_00[2] = b_00[2] - wVar12;
          iVar11 = wwCmp2(b_00,3,puVar1 + -2,3);
        }
        if (m == 0) {
          uVar15 = 0;
        }
        else {
          uVar20 = q[lVar16];
          sVar19 = 0;
          uVar15 = 0;
          do {
            auVar10._8_8_ = 0;
            auVar10._0_8_ = uVar15;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = uVar20;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = b_01[sVar19];
            auVar10 = auVar6 * auVar8 + auVar10;
            uVar14 = auVar10._0_8_;
            puVar2 = (ulong *)(lVar21 + sVar19 * 8);
            uVar15 = *puVar2;
            *puVar2 = *puVar2 - uVar14;
            uVar15 = auVar10._8_8_ + (ulong)(uVar15 < uVar14);
            sVar19 = sVar19 + 1;
          } while (m != sVar19);
        }
        uVar20 = *puVar1;
        *puVar1 = uVar20 - uVar15;
        if (CARRY8(uVar20 - uVar15,uVar15)) {
          q[lVar16] = q[lVar16] - 1;
          wVar12 = zzAdd2(puVar1 + -m,b_01,m);
          *puVar1 = *puVar1 + wVar12;
        }
        sVar17 = sVar17 - 1;
        lVar21 = lVar21 + -8;
      } while (m <= sVar17);
    }
    wwShLo((word *)stack,n + 1,sVar13);
  }
  wwCopy(r,(word *)stack,m);
  return;
}

Assistant:

void zzDiv(word q[], word r[], const word a[], size_t n, const word b[],
	size_t m, void* stack)
{
	register dword qhat;
	register size_t shift;
	register word t;
	size_t i;
	// переменные в stack
	word* divident;		/*< нормализованное делимое (n + 1 слово) */
	word* divisor;		/*< нормализованный делитель (m слов) */
	word* mul;			/*< вспомогательное произведение (3 слова) */
	// pre
	ASSERT(n >= m);
	ASSERT(wwIsValid(a, n) && wwIsValid(b, m));
	ASSERT(m > 0 && b[m - 1] > 0);
	ASSERT(wwIsDisjoint2(q, n + 1 - m, r, m));
	ASSERT(a == r || wwIsDisjoint2(a, n, r, m));
	// a < b?
	if (wwCmp2(a, n, b, m) < 0)
	{
		// q <- 0, r <- a
		wwSetZero(q, n - m + 1);
		wwCopy(r, a, m);
		return;
	}
	// делим на одноразрядное число?
	if (m == 1)
	{
		r[0] = zzDivW(q, a, n, b[0]);
		return;
	}
	// резервируем переменные в stack
	divident = (word*)stack;
	divisor = divident + n + 1;
	mul = divisor + m;
	stack = mul + 3;
	// divident <- a
	wwCopy(divident, a, n);
	divident[n] = 0;
	// divisor <- b
	wwCopy(divisor, b, m);
	// нормализация
	shift = wordCLZ(b[m - 1]);
	wwShHi(divident, n + 1, shift);
	wwShHi(divisor, m, shift);
	// цикл по разрядам делимого
	for (i = n; i >= m; --i)
	{
		// вычислить пробное частное
		if (divident[i] == divisor[m - 1])
			q[i - m] = WORD_MAX;
		else
		{
			qhat = divident[i];
			qhat <<= B_PER_W;
			qhat |= divident[i - 1];
			qhat /= divisor[m - 1];
			q[i - m] = (word)qhat;
		}
		// уточнить пробное частное
		wwCopy(mul, divisor + m - 2, 2);
		mul[2] = zzMulW(mul, mul, 2, q[i - m]);
		while (wwCmp2(mul, 3, divident + i - 2, 3) > 0)
		{
			q[i - m]--;
			mul[2] -= zzSub2(mul, divisor + m - 2, 2);
		}
		// учесть пробное частное
		t = zzSubMulW(divident + i - m, divisor, m, q[i - m]);
		divident[i] -= t;
		if (divident[i] > (word)~t)
		{
			// окончательно подправить пробное частное
			q[i - m]--;
			// корректирующее сложение
			divident[i] += zzAdd2(divident + i - m, divisor, m);
		}
	}
	// денормализация
	wwShLo(divident, n + 1, shift);
	// сохранить остаток
	wwCopy(r, divident, m);
	// очистить регистровые переменные
	t = 0, shift = 0, qhat = 0;
}